

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

const_iterator
cmRemoveIndices<std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *r,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *rem)

{
  bool bVar1;
  reference puVar2;
  bool local_89;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_78;
  value_type_conflict1 local_70;
  cmGeneratorTarget **local_68;
  cmGeneratorTarget **local_60;
  size_t local_58;
  size_t count;
  value_type_conflict1 prevRem;
  iterator pivot;
  iterator writer;
  iterator rangeEnd;
  const_iterator remEnd;
  const_iterator remIt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *rem_local;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *r_local;
  
  remEnd = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(rem);
  rangeEnd._M_current =
       (cmGeneratorTarget **)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(rem);
  writer = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(r);
  bVar1 = __gnu_cxx::operator==
                    (&remEnd,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&rangeEnd);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
    ::__normal_iterator<cmGeneratorTarget**>
              ((__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
                *)&r_local,&writer);
  }
  else {
    pivot = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(r);
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&remEnd);
    std::
    advance<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,unsigned_long>
              (&pivot,*puVar2);
    prevRem = (value_type_conflict1)pivot._M_current;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&remEnd);
    count = *puVar2;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&remEnd);
    local_58 = 1;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&pivot,&writer);
      local_89 = false;
      if (bVar1) {
        local_89 = __gnu_cxx::operator!=
                             (&remEnd,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&rangeEnd);
      }
      if (local_89 == false) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&remEnd);
      std::
      advance<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,unsigned_long>
                ((__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  *)&prevRem,*puVar2 - count);
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&remEnd);
      count = *puVar2;
      local_68 = pivot._M_current;
      local_70 = prevRem;
      local_60 = (cmGeneratorTarget **)
                 ContainerAlgorithms::
                 RemoveN<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>>
                           (pivot._M_current,
                            (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                             )prevRem,local_58);
      local_58 = local_58 + 1;
      pivot._M_current = local_60;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&remEnd);
    }
    local_78 = ContainerAlgorithms::
               RemoveN<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>>
                         (pivot._M_current,writer._M_current,local_58);
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
    ::__normal_iterator<cmGeneratorTarget**>
              ((__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
                *)&r_local,&local_78);
  }
  return (const_iterator)(cmGeneratorTarget **)r_local;
}

Assistant:

typename Range::const_iterator cmRemoveIndices(Range& r, InputRange const& rem)
{
  typename InputRange::const_iterator remIt = rem.begin();
  typename InputRange::const_iterator remEnd = rem.end();
  const typename Range::iterator rangeEnd = r.end();
  if (remIt == remEnd)
    {
    return rangeEnd;
    }

  typename Range::iterator writer = r.begin();
  std::advance(writer, *remIt);
  typename Range::iterator pivot = writer;
  typename InputRange::value_type prevRem = *remIt;
  ++remIt;
  size_t count = 1;
  for ( ; writer != rangeEnd && remIt != remEnd; ++count, ++remIt)
    {
    std::advance(pivot, *remIt - prevRem);
    prevRem = *remIt;
    writer = ContainerAlgorithms::RemoveN(writer, pivot, count);
    }
  return ContainerAlgorithms::RemoveN(writer, rangeEnd, count);
}